

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O0

int __thiscall ncnn::Scale::forward_inplace(Scale *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  reference pvVar3;
  undefined8 in_RDX;
  reference in_RSI;
  long *in_RDI;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_top_blobs;
  allocator_type *in_stack_ffffffffffffff10;
  reference pvVar4;
  size_type in_stack_ffffffffffffff18;
  reference pvVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffff20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a0;
  undefined8 local_88;
  reference local_80;
  int local_70;
  undefined4 local_6c;
  reference local_68;
  reference local_60;
  reference local_58;
  int local_50;
  undefined4 local_4c;
  reference local_48;
  reference local_40;
  reference local_38;
  int local_30;
  undefined4 local_2c;
  reference local_28;
  int local_20;
  undefined4 local_1c;
  reference local_18;
  void *local_10;
  void *local_8;
  
  local_88 = in_RDX;
  local_80 = in_RSI;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0xe297ab);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0xe297cb);
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_a0,0);
  local_48 = local_80;
  local_40 = pvVar3;
  if (pvVar3 != local_80) {
    if (local_80->refcount != (int *)0x0) {
      piVar1 = local_80->refcount;
      local_4c = 1;
      LOCK();
      local_50 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    pvVar4 = pvVar3;
    local_28 = pvVar3;
    if (pvVar3->refcount != (int *)0x0) {
      piVar1 = pvVar3->refcount;
      local_2c = 0xffffffff;
      LOCK();
      local_30 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_30 == 1) {
        if (pvVar3->allocator == (Allocator *)0x0) {
          local_8 = pvVar3->data;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
        }
      }
    }
    pvVar4->data = (void *)0x0;
    pvVar4->elemsize = 0;
    pvVar4->elempack = 0;
    pvVar4->dims = 0;
    pvVar4->w = 0;
    pvVar4->h = 0;
    pvVar4->d = 0;
    pvVar4->c = 0;
    pvVar4->cstep = 0;
    pvVar4->refcount = (int *)0x0;
    pvVar3->data = local_48->data;
    pvVar3->refcount = local_48->refcount;
    pvVar3->elemsize = local_48->elemsize;
    pvVar3->elempack = local_48->elempack;
    pvVar3->allocator = local_48->allocator;
    pvVar3->dims = local_48->dims;
    pvVar3->w = local_48->w;
    pvVar3->h = local_48->h;
    pvVar3->d = local_48->d;
    pvVar3->c = local_48->c;
    pvVar3->cstep = local_48->cstep;
  }
  pvVar4 = (reference)(in_RDI + 0x1b);
  local_38 = pvVar3;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_a0,1);
  local_68 = pvVar4;
  local_60 = pvVar3;
  if (pvVar3 != pvVar4) {
    if (pvVar4->refcount != (int *)0x0) {
      piVar1 = pvVar4->refcount;
      local_6c = 1;
      LOCK();
      local_70 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    pvVar5 = pvVar3;
    local_18 = pvVar3;
    if (pvVar3->refcount != (int *)0x0) {
      piVar1 = pvVar3->refcount;
      local_1c = 0xffffffff;
      LOCK();
      local_20 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_20 == 1) {
        if (pvVar3->allocator == (Allocator *)0x0) {
          local_10 = pvVar3->data;
          if (local_10 != (void *)0x0) {
            free(local_10);
          }
        }
        else {
          (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
        }
      }
    }
    pvVar3->data = (void *)0x0;
    pvVar3->elemsize = 0;
    pvVar3->elempack = 0;
    pvVar3->dims = 0;
    pvVar3->w = 0;
    pvVar3->h = 0;
    pvVar3->d = 0;
    pvVar3->c = 0;
    pvVar3->cstep = 0;
    pvVar3->refcount = (int *)0x0;
    pvVar5->data = local_68->data;
    pvVar5->refcount = local_68->refcount;
    pvVar5->elemsize = local_68->elemsize;
    pvVar5->elempack = local_68->elempack;
    pvVar5->allocator = local_68->allocator;
    pvVar5->dims = local_68->dims;
    pvVar5->w = local_68->w;
    pvVar5->h = local_68->h;
    pvVar5->d = local_68->d;
    pvVar5->c = local_68->c;
    pvVar5->cstep = local_68->cstep;
    pvVar3 = pvVar5;
  }
  local_58 = pvVar3;
  iVar2 = (**(code **)(*in_RDI + 0x40))(in_RDI,&local_a0,local_88);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar4);
  return iVar2;
}

Assistant:

int Scale::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_top_blobs(2);
    bottom_top_blobs[0] = bottom_top_blob;
    bottom_top_blobs[1] = scale_data;

    return forward_inplace(bottom_top_blobs, opt);
}